

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptStringObject::SetProperty
          (JavascriptStringObject *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  BOOL BVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)info;
  ScriptContext::FindPropertyRecord
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_40);
  if ((local_40 == (PropertyRecord *)0x0) || (local_40->pid != 0xd1)) {
    BVar1 = DynamicObject::SetProperty
                      (&this->super_DynamicObject,propertyNameString,value,flags,
                       (PropertyValueInfo *)propertyRecord);
  }
  else {
    JavascriptError::ThrowCantAssignIfStrictMode
              (flags,(((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
    BVar1 = 0;
  }
  return BVar1;
}

Assistant:

BOOL JavascriptStringObject::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        bool result;
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && SetPropertyBuiltIns(propertyRecord->GetPropertyId(), flags, &result))
        {
            return result;
        }
        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    }